

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeDeclaration_Tag.cpp
# Opt level: O3

MemberDeclarationSymbol * __thiscall
psy::C::TagDeclarationSymbol::member(TagDeclarationSymbol *this,Identifier *name)

{
  pointer ppMVar1;
  SymbolKind SVar2;
  bool bVar3;
  TypeKind TVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  Type *pTVar6;
  ostream *poVar7;
  undefined4 extraout_var_07;
  TagDeclarationSymbol *this_00;
  MemberDeclarationSymbol *pMVar8;
  pointer ppMVar9;
  pointer ppMVar10;
  long lVar11;
  long lVar12;
  
  ppMVar9 = (this->membDecls_).
            super__Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppMVar1 = (this->membDecls_).
            super__Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  lVar11 = (long)ppMVar1 - (long)ppMVar9;
  if (0 < lVar11 >> 5) {
    lVar12 = (lVar11 >> 5) + 1;
    ppMVar9 = ppMVar9 + 2;
    do {
      ppMVar10 = ppMVar9;
      iVar5 = (*(ppMVar10[-2]->super_DeclarationSymbol).super_Symbol._vptr_Symbol[0x25])();
      if ((Identifier *)CONCAT44(extraout_var,iVar5) == name) {
        ppMVar10 = ppMVar10 + -2;
        goto LAB_002d187e;
      }
      iVar5 = (*(ppMVar10[-1]->super_DeclarationSymbol).super_Symbol._vptr_Symbol[0x25])();
      if ((Identifier *)CONCAT44(extraout_var_00,iVar5) == name) {
        ppMVar10 = ppMVar10 + -1;
        goto LAB_002d187e;
      }
      iVar5 = (*((*ppMVar10)->super_DeclarationSymbol).super_Symbol._vptr_Symbol[0x25])();
      if ((Identifier *)CONCAT44(extraout_var_01,iVar5) == name) goto LAB_002d187e;
      iVar5 = (*(ppMVar10[1]->super_DeclarationSymbol).super_Symbol._vptr_Symbol[0x25])();
      if ((Identifier *)CONCAT44(extraout_var_02,iVar5) == name) {
        ppMVar10 = ppMVar10 + 1;
        goto LAB_002d187e;
      }
      lVar12 = lVar12 + -1;
      lVar11 = lVar11 + -0x20;
      ppMVar9 = ppMVar10 + 4;
    } while (1 < lVar12);
    ppMVar9 = ppMVar10 + 2;
  }
  lVar11 = lVar11 >> 3;
  if (lVar11 != 1) {
    if (lVar11 != 2) {
      ppMVar10 = ppMVar1;
      if ((lVar11 != 3) ||
         (iVar5 = (*((*ppMVar9)->super_DeclarationSymbol).super_Symbol._vptr_Symbol[0x25])(),
         ppMVar10 = ppMVar9, (Identifier *)CONCAT44(extraout_var_03,iVar5) == name))
      goto LAB_002d187e;
      ppMVar9 = ppMVar9 + 1;
    }
    iVar5 = (*((*ppMVar9)->super_DeclarationSymbol).super_Symbol._vptr_Symbol[0x25])();
    ppMVar10 = ppMVar9;
    if ((Identifier *)CONCAT44(extraout_var_04,iVar5) == name) goto LAB_002d187e;
    ppMVar9 = ppMVar9 + 1;
  }
  iVar5 = (*((*ppMVar9)->super_DeclarationSymbol).super_Symbol._vptr_Symbol[0x25])();
  ppMVar10 = ppMVar9;
  if ((Identifier *)CONCAT44(extraout_var_05,iVar5) != name) {
    ppMVar10 = ppMVar1;
  }
LAB_002d187e:
  if (ppMVar10 ==
      (this->membDecls_).
      super__Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    for (ppMVar9 = (this->membDecls_).
                   super__Vector_base<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppMVar9 != ppMVar10;
        ppMVar9 = ppMVar9 + 1) {
      pMVar8 = *ppMVar9;
      SVar2 = Symbol::kind((Symbol *)pMVar8);
      if (SVar2 == FieldDeclaration) {
        iVar5 = (*(pMVar8->super_DeclarationSymbol).super_Symbol._vptr_Symbol[0x15])(pMVar8);
        pMVar8 = (MemberDeclarationSymbol *)CONCAT44(extraout_var_06,iVar5);
        bVar3 = FieldDeclarationSymbol::isAnonymousStructureOrUnion
                          ((FieldDeclarationSymbol *)pMVar8);
        if (bVar3) {
          pTVar6 = MemberDeclarationSymbol::type(pMVar8);
          TVar4 = Type::kind(pTVar6);
          if (TVar4 != Tag) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"[ASSERT] at ",0xc);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/symbols/TypeDeclaration_Tag.cpp"
                       ,0x65);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x61);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"<empty message>",0xf);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
          }
          pTVar6 = MemberDeclarationSymbol::type(pMVar8);
          iVar5 = (*pTVar6->_vptr_Type[0xd])(pTVar6);
          this_00 = TagType::declaration((TagType *)CONCAT44(extraout_var_07,iVar5));
          if ((this_00 != (TagDeclarationSymbol *)0x0) &&
             (pMVar8 = member(this_00,name), pMVar8 != (MemberDeclarationSymbol *)0x0)) {
            return pMVar8;
          }
        }
      }
    }
    pMVar8 = (MemberDeclarationSymbol *)0x0;
  }
  else {
    pMVar8 = *ppMVar10;
  }
  return pMVar8;
}

Assistant:

const MemberDeclarationSymbol* TagDeclarationSymbol::member(const Identifier* name) const
{
    auto it = std::find_if(membDecls_.begin(),
                           membDecls_.end(),
                           [name] (const MemberDeclarationSymbol* membDecl) {
                                return membDecl->name() == name;
                           });
    if (it != membDecls_.end())
        return *it;

    for (const auto membDecl : membDecls_) {
        if (membDecl->kind() != SymbolKind::FieldDeclaration)
            continue;
        auto fldDecl = membDecl->asFieldDeclaration();
        if (fldDecl->isAnonymousStructureOrUnion()) {
            PSY_ASSERT_2(fldDecl->type()->kind() == TypeKind::Tag, continue);
            auto tagTyDecl = fldDecl->type()->asTagType()->declaration();
            if (!tagTyDecl)
                continue;
            auto innerMembDecl = tagTyDecl->member(name);
            if (innerMembDecl)
                return innerMembDecl;
        }
    }
    return nullptr;
}